

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Writer::FlushData(BP5Writer *this,bool isFinal)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  byte in_SIL;
  unsigned_long *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> RecvBuffer;
  size_t tmp [2];
  uint64_t databufsize;
  BufferV *in_stack_000000e8;
  BP5Writer *in_stack_000000f0;
  BufferV *DataBuf;
  value_type *__x;
  int in_stack_fffffffffffffef0;
  BufferV *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  double in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  allocator *ChunkSize;
  size_t in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined8 in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  ChunkV *in_stack_ffffffffffffff40;
  Comm *in_stack_ffffffffffffff50;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  undefined1 in_stack_ffffffffffffffb7;
  BufferV *in_stack_ffffffffffffffb8;
  BP5Serializer *in_stack_ffffffffffffffc0;
  BufferV *local_18;
  byte local_9;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_9 = in_SIL & 1;
  if ((int)in_RDI[0x3d] == 0) {
    iVar2 = (int)((ulong)(in_RDI + 0x52) >> 0x20);
    in_stack_ffffffffffffff38 = (string *)operator_new(0xa0);
    local_4d = 1;
    in_stack_ffffffffffffff40 = (ChunkV *)&stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc8,"BP5Writer",(allocator *)in_stack_ffffffffffffff40
              );
    adios2::format::MallocV::MallocV
              ((MallocV *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               SUB41((uint)iVar2 >> 0x18,0),
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    local_4d = 0;
    local_18 = adios2::format::BP5Serializer::ReinitStepData
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          (bool)in_stack_ffffffffffffffb7);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  }
  else {
    operator_new(0xb0);
    ChunkSize = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"BP5Writer",ChunkSize);
    adios2::format::ChunkV::ChunkV
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,SUB41((uint)iVar2 >> 0x18,0),
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20,(size_t)ChunkSize);
    in_stack_ffffffffffffff07 = 1;
    if (*(int *)((long)in_RDI + 0x1bc) == 0) {
      in_stack_ffffffffffffff07 = (undefined1)in_RDI[0x35];
    }
    in_stack_fffffffffffffef8 =
         adios2::format::BP5Serializer::ReinitStepData
                   (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                    (bool)in_stack_ffffffffffffffb7);
    local_18 = in_stack_fffffffffffffef8;
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  uVar3 = adios2::format::BufferV::Size(local_18);
  WriteData(in_stack_000000f0,in_stack_000000e8);
  local_18 = (BufferV *)0x0;
  in_RDI[0x184] = uVar3 + in_RDI[0x184];
  if ((local_9 & 1) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa8ed7c);
    iVar1 = helper::Comm::Rank((Comm *)0xa8ed8a);
    if (iVar1 == 0) {
      in_stack_fffffffffffffef0 = helper::Comm::Size((Comm *)0xa8eda7);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 (size_type)in_stack_fffffffffffffef8);
    }
    __x = (value_type *)(in_RDI + 0xb);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa8edff);
    helper::Comm::GatherArrays<unsigned_long>
              (in_stack_ffffffffffffff50,in_RDI,(size_t)in_stack_ffffffffffffff40,
               (unsigned_long *)in_stack_ffffffffffffff38,iVar2);
    iVar2 = helper::Comm::Rank((Comm *)0xa8ee2c);
    if (iVar2 == 0) {
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)CONCAT44(iVar1,in_stack_fffffffffffffef0),__x);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(iVar1,in_stack_fffffffffffffef0));
  }
  return;
}

Assistant:

void BP5Writer::FlushData(const bool isFinal)
{
    BufferV *DataBuf;
    if (m_Parameters.BufferVType == (int)BufferVType::MallocVType)
    {
        DataBuf = m_BP5Serializer.ReinitStepData(
            new MallocV("BP5Writer", false, m_BP5Serializer.m_BufferAlign,
                        m_BP5Serializer.m_BufferBlockSize, m_Parameters.InitialBufferSize,
                        m_Parameters.GrowthFactor),
            m_Parameters.AsyncWrite || m_Parameters.DirectIO);
    }
    else
    {
        DataBuf = m_BP5Serializer.ReinitStepData(
            new ChunkV("BP5Writer", false, m_BP5Serializer.m_BufferAlign,
                       m_BP5Serializer.m_BufferBlockSize, m_Parameters.BufferChunkSize),
            m_Parameters.AsyncWrite || m_Parameters.DirectIO);
    }

    auto databufsize = DataBuf->Size();
    WriteData(DataBuf);
    /* DataBuf is deleted in WriteData() */
    DataBuf = nullptr;

    m_ThisTimestepDataSize += databufsize;

    if (!isFinal)
    {
        size_t tmp[2];
        // aggregate start pos and data size to rank 0
        tmp[0] = m_StartDataPos;
        tmp[1] = databufsize;

        std::vector<size_t> RecvBuffer;
        if (m_Comm.Rank() == 0)
        {
            RecvBuffer.resize(m_Comm.Size() * 2);
        }
        m_Comm.GatherArrays(tmp, 2, RecvBuffer.data(), 0);
        if (m_Comm.Rank() == 0)
        {
            FlushPosSizeInfo.push_back(RecvBuffer);
        }
    }
}